

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_verify_mlsag
              (secp256k1_context *ctx,uint8_t *preimage,size_t nCols,size_t nRows,uint8_t *pk,
              uint8_t *ki,uint8_t *pc,uint8_t *ps)

{
  int iVar1;
  secp256k1_gej *in_RCX;
  secp256k1_sha256 *in_RDX;
  int overflow;
  size_t clen;
  size_t k;
  size_t i;
  uint8_t tmp [33];
  size_t dsRows;
  secp256k1_gej R;
  secp256k1_gej L;
  secp256k1_gej gej2;
  secp256k1_gej gej1;
  secp256k1_ge ge1;
  secp256k1_scalar ss;
  secp256k1_scalar cSig;
  secp256k1_scalar clast;
  secp256k1_scalar zero;
  secp256k1_sha256 sha256_pre;
  secp256k1_sha256 sha256_m;
  secp256k1_scalar *in_stack_00000800;
  secp256k1_scalar *in_stack_00000808;
  secp256k1_gej *in_stack_00000810;
  secp256k1_gej *in_stack_00000818;
  secp256k1_ecmult_context *in_stack_00000820;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  secp256k1_gej *in_stack_fffffffffffffbd0;
  secp256k1_gej *in_stack_fffffffffffffbd8;
  secp256k1_gej *elem;
  secp256k1_sha256 *in_stack_fffffffffffffbe0;
  secp256k1_sha256 *hash;
  secp256k1_scalar *in_stack_fffffffffffffbf0;
  secp256k1_scalar *in_stack_fffffffffffffbf8;
  secp256k1_sha256 *in_stack_fffffffffffffc00;
  secp256k1_gej *a;
  secp256k1_ge *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc48;
  uchar *in_stack_fffffffffffffc50;
  secp256k1_ge *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc88;
  uint8_t *in_stack_fffffffffffffc90;
  secp256k1_ge *in_stack_fffffffffffffc98;
  secp256k1_fe *in_stack_fffffffffffffda8;
  secp256k1_gej *in_stack_fffffffffffffdb0;
  secp256k1_gej *in_stack_fffffffffffffdb8;
  secp256k1_gej *in_stack_fffffffffffffdc0;
  secp256k1_scalar local_188;
  uint64_t local_168;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  secp256k1_scalar local_148;
  secp256k1_scalar local_128;
  undefined1 local_108 [104];
  secp256k1_sha256 local_a0;
  secp256k1_gej *local_28;
  secp256k1_sha256 *local_20;
  int local_4;
  
  a = (secp256k1_gej *)&in_RCX[-1].field_0x7f;
  local_28 = in_RCX;
  local_20 = in_RDX;
  secp256k1_scalar_set_int(&local_128,0);
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)in_stack_fffffffffffffbe0,(uchar *)in_stack_fffffffffffffbd8,
             (int *)in_stack_fffffffffffffbd0);
  if ((in_stack_fffffffffffffbcc == 0) && (iVar1 = secp256k1_scalar_is_zero(&local_148), iVar1 == 0)
     ) {
    local_168 = local_148.d[0];
    local_160 = local_148.d[1];
    local_158 = local_148.d[2];
    local_150 = local_148.d[3];
    secp256k1_sha256_initialize(&local_a0);
    secp256k1_sha256_write
              (in_stack_fffffffffffffbe0,(uchar *)in_stack_fffffffffffffbd8,
               (size_t)in_stack_fffffffffffffbd0);
    memcpy(local_108,&local_a0,0x68);
    for (hash = (secp256k1_sha256 *)0x0; hash < local_20;
        hash = (secp256k1_sha256 *)((long)hash->s + 1)) {
      memcpy(&local_a0,local_108,0x68);
      in_stack_fffffffffffffbd8 = a;
      for (elem = (secp256k1_gej *)0x0; a = in_stack_fffffffffffffbd8,
          elem < in_stack_fffffffffffffbd8; elem = (secp256k1_gej *)((long)(elem->x).n + 1)) {
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)hash,(uchar *)elem,(int *)in_stack_fffffffffffffbd0);
        if ((in_stack_fffffffffffffbcc != 0) ||
           (iVar1 = secp256k1_scalar_is_zero(&local_188), iVar1 != 0)) {
          return 1;
        }
        iVar1 = secp256k1_eckey_pubkey_parse
                          (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                           in_stack_fffffffffffffc48);
        if (iVar1 == 0) {
          return 1;
        }
        secp256k1_gej_set_ge
                  (in_stack_fffffffffffffbd0,
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        secp256k1_ecmult(in_stack_00000820,in_stack_00000818,in_stack_00000810,in_stack_00000808,
                         in_stack_00000800);
        iVar1 = hash_to_curve(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                              in_stack_fffffffffffffc88);
        if (iVar1 != 0) {
          return 1;
        }
        secp256k1_gej_set_ge
                  (in_stack_fffffffffffffbd0,
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        secp256k1_ecmult(in_stack_00000820,in_stack_00000818,in_stack_00000810,in_stack_00000808,
                         in_stack_00000800);
        iVar1 = secp256k1_eckey_pubkey_parse
                          (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                           in_stack_fffffffffffffc48);
        if (iVar1 == 0) {
          return 1;
        }
        secp256k1_gej_set_ge
                  (in_stack_fffffffffffffbd0,
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        secp256k1_ecmult(in_stack_00000820,in_stack_00000818,in_stack_00000810,in_stack_00000808,
                         in_stack_00000800);
        secp256k1_gej_add_var
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8);
        secp256k1_sha256_write(hash,(uchar *)elem,(size_t)in_stack_fffffffffffffbd0);
        secp256k1_ge_set_gej(in_stack_fffffffffffffc20,in_stack_fffffffffffffbd8);
        secp256k1_eckey_pubkey_serialize
                  ((secp256k1_ge *)elem,(uchar *)in_stack_fffffffffffffbd0,
                   (size_t *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),0);
        secp256k1_sha256_write(hash,(uchar *)elem,(size_t)in_stack_fffffffffffffbd0);
        secp256k1_ge_set_gej(in_stack_fffffffffffffc20,in_stack_fffffffffffffbd8);
        secp256k1_eckey_pubkey_serialize
                  ((secp256k1_ge *)elem,(uchar *)in_stack_fffffffffffffbd0,
                   (size_t *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),0);
        secp256k1_sha256_write(hash,(uchar *)elem,(size_t)in_stack_fffffffffffffbd0);
      }
      for (; in_stack_fffffffffffffbd8 < local_28;
          in_stack_fffffffffffffbd8 = (secp256k1_gej *)((long)(in_stack_fffffffffffffbd8->x).n + 1))
      {
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)hash,(uchar *)in_stack_fffffffffffffbd8,
                   (int *)in_stack_fffffffffffffbd0);
        if ((in_stack_fffffffffffffbcc != 0) ||
           (iVar1 = secp256k1_scalar_is_zero(&local_188), iVar1 != 0)) {
          return 1;
        }
        iVar1 = secp256k1_eckey_pubkey_parse
                          (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                           in_stack_fffffffffffffc48);
        if (iVar1 == 0) {
          return 1;
        }
        secp256k1_gej_set_ge
                  (in_stack_fffffffffffffbd0,
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        secp256k1_ecmult(in_stack_00000820,in_stack_00000818,in_stack_00000810,in_stack_00000808,
                         in_stack_00000800);
        secp256k1_sha256_write
                  (hash,(uchar *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
        secp256k1_ge_set_gej(in_stack_fffffffffffffc20,a);
        secp256k1_eckey_pubkey_serialize
                  ((secp256k1_ge *)in_stack_fffffffffffffbd8,(uchar *)in_stack_fffffffffffffbd0,
                   (size_t *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),0);
        secp256k1_sha256_write
                  (hash,(uchar *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
      }
      secp256k1_sha256_finalize(in_stack_fffffffffffffc00,(uchar *)in_stack_fffffffffffffbf8);
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)hash,(uchar *)in_stack_fffffffffffffbd8,
                 (int *)in_stack_fffffffffffffbd0);
      if ((in_stack_fffffffffffffbcc != 0) ||
         (iVar1 = secp256k1_scalar_is_zero(&local_148), iVar1 != 0)) {
        return 1;
      }
    }
    secp256k1_scalar_negate((secp256k1_scalar *)hash,(secp256k1_scalar *)in_stack_fffffffffffffbd8);
    secp256k1_scalar_add
              ((secp256k1_scalar *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
    iVar1 = secp256k1_scalar_is_zero(&local_128);
    local_4 = 2;
    if (iVar1 != 0) {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_verify_mlsag(const secp256k1_context *ctx,
    const uint8_t *preimage, size_t nCols, size_t nRows,
    const uint8_t *pk, const uint8_t *ki, const uint8_t *pc, const uint8_t *ps)
{
    secp256k1_sha256 sha256_m, sha256_pre;
    secp256k1_scalar zero, clast, cSig, ss;
    secp256k1_ge ge1;
    secp256k1_gej gej1, gej2, L, R;
    size_t dsRows = nRows-1; /* TODO: pass in dsRows explicitly? */
    uint8_t tmp[33];
    size_t i, k, clen;
    int overflow;

    secp256k1_scalar_set_int(&zero, 0);

    secp256k1_scalar_set_b32(&clast, pc, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&clast)) {
        return 1;
    }

    cSig = clast;

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, preimage, 32);
    sha256_pre = sha256_m;

    for (i = 0; i < nCols; ++i) {
        sha256_m = sha256_pre; /* set to after preimage hashed */

        for (k = 0; k < dsRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            /* R = H(pk[k][i]) * ss + ki[k] * clast */
            if (0 != hash_to_curve(&ge1, &pk[(i + k*nCols)*33], 33)) { /* H(pk[k][i]) */
                return 1;
            }
            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej1, &gej1, &ss, &zero); /* gej1 = H(pk[k][i]) * ss */

            if (!secp256k1_eckey_pubkey_parse(&ge1, &ki[k * 33], 33)) {
                return 1;
            }
            secp256k1_gej_set_ge(&gej2, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej2, &clast, &zero); /* gej2 = ki[k] * clast */

            secp256k1_gej_add_var(&R, &gej1, &gej2, NULL);  /* R =  gej1 + gej2 */

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
            secp256k1_ge_set_gej(&ge1, &R);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* R */
        }

        for (k = dsRows; k < nRows; ++k) {
            /* L = G * ss + pk[k][i] * clast */
            secp256k1_scalar_set_b32(&ss, &ps[(i + k*nCols)*32], &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ss)) {
                return 1;
            }
            if (!secp256k1_eckey_pubkey_parse(&ge1, &pk[(i + k*nCols)*33], 33)) {
                return 1;
            }

            secp256k1_gej_set_ge(&gej1, &ge1);
            secp256k1_ecmult(&ctx->ecmult_ctx, &L, &gej1, &clast, &ss);

            secp256k1_sha256_write(&sha256_m, &pk[(i + k*nCols)*33], 33); /* pk[k][i] */
            secp256k1_ge_set_gej(&ge1, &L);
            secp256k1_eckey_pubkey_serialize(&ge1, tmp, &clen, 1);
            secp256k1_sha256_write(&sha256_m, tmp, 33); /* L */
        };

        secp256k1_sha256_finalize(&sha256_m, tmp);
        secp256k1_scalar_set_b32(&clast, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&clast)) {
            return 1;
        }
    }

    secp256k1_scalar_negate(&cSig, &cSig);
    secp256k1_scalar_add(&zero, &clast, &cSig);

    return secp256k1_scalar_is_zero(&zero) ? 0 : 2; /* return 0 on success, 2 on failure */
}